

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

PyObject * libxml_xmlSchemaSetValidErrors(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *pPVar2;
  Py_ssize_t PVar3;
  int val;
  xmlSchemaValidCtxtPyCtxtPtr pyCtxt;
  PyObject *pyobj_arg;
  PyObject *pyobj_ctx;
  PyObject *pyobj_warn;
  PyObject *pyobj_error;
  
  pyobj_arg = (PyObject *)&_Py_NoneStruct;
  iVar1 = _PyArg_ParseTuple_SizeT
                    (args,"OOO|O:xmlSchemaSetValidErrors",&pyobj_ctx,&pyobj_error,&pyobj_warn);
  if (iVar1 == 0) {
    return (PyObject *)0x0;
  }
  if (pyobj_ctx == (PyObject *)&_Py_NoneStruct) {
    PVar3 = 0;
  }
  else {
    PVar3 = pyobj_ctx[1].ob_refcnt;
  }
  iVar1 = xmlSchemaGetValidErrors(PVar3,0,0,&pyCtxt);
  val = -1;
  if (iVar1 != -1) {
    if (pyCtxt == (xmlSchemaValidCtxtPyCtxtPtr)0x0) {
      pyCtxt = (xmlSchemaValidCtxtPyCtxtPtr)(*_xmlMalloc)(0x18);
      if (pyCtxt == (xmlSchemaValidCtxtPyCtxtPtr)0x0) goto LAB_0013b9be;
      pyCtxt->warn = (PyObject *)0x0;
      pyCtxt->error = (PyObject *)0x0;
      pyCtxt->arg = (PyObject *)0x0;
    }
    _Py_XDECREF(pyCtxt->error);
    if (pyobj_error != (PyObject *)0x0) {
      pyobj_error->ob_refcnt = pyobj_error->ob_refcnt + 1;
    }
    pyCtxt->error = pyobj_error;
    _Py_XDECREF(pyCtxt->warn);
    if (pyobj_warn != (PyObject *)0x0) {
      pyobj_warn->ob_refcnt = pyobj_warn->ob_refcnt + 1;
    }
    pyCtxt->warn = pyobj_warn;
    _Py_XDECREF(pyCtxt->arg);
    if (pyobj_arg != (PyObject *)0x0) {
      pyobj_arg->ob_refcnt = pyobj_arg->ob_refcnt + 1;
    }
    pyCtxt->arg = pyobj_arg;
    xmlSchemaSetValidErrors
              (PVar3,libxml_xmlSchemaValidityErrorFunc,libxml_xmlSchemaValidityWarningFunc);
    val = 1;
  }
LAB_0013b9be:
  pPVar2 = libxml_intWrap(val);
  return pPVar2;
}

Assistant:

PyObject *
libxml_xmlSchemaSetValidErrors(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
	PyObject *py_retval;
	PyObject *pyobj_error;
	PyObject *pyobj_warn;
	PyObject *pyobj_ctx;
	PyObject *pyobj_arg = Py_None;
	xmlSchemaValidCtxtPtr ctxt;
	xmlSchemaValidCtxtPyCtxtPtr pyCtxt;

	if (!PyArg_ParseTuple
		(args, (char *) "OOO|O:xmlSchemaSetValidErrors", &pyobj_ctx, &pyobj_error, &pyobj_warn, &pyobj_arg))
		return (NULL);

#ifdef DEBUG_ERROR
	printf("libxml_xmlSchemaSetValidErrors(%p, %p, %p) called\n", pyobj_ctx, pyobj_error, pyobj_warn);
#endif

	ctxt = PySchemaValidCtxt_Get(pyobj_ctx);
	if (xmlSchemaGetValidErrors(ctxt, NULL, NULL, (void **) &pyCtxt) == -1)
	{
		py_retval = libxml_intWrap(-1);
		return(py_retval);
	}

	if (pyCtxt == NULL)
	{
		/* first time to set the error handlers */
		pyCtxt = xmlMalloc(sizeof(xmlSchemaValidCtxtPyCtxt));
		if (pyCtxt == NULL) {
			py_retval = libxml_intWrap(-1);
			return(py_retval);
		}
		memset(pyCtxt, 0, sizeof(xmlSchemaValidCtxtPyCtxt));
	}

	/* TODO: check warn and error is a function ! */
	Py_XDECREF(pyCtxt->error);
	Py_XINCREF(pyobj_error);
	pyCtxt->error = pyobj_error;

	Py_XDECREF(pyCtxt->warn);
	Py_XINCREF(pyobj_warn);
	pyCtxt->warn = pyobj_warn;

	Py_XDECREF(pyCtxt->arg);
	Py_XINCREF(pyobj_arg);
	pyCtxt->arg = pyobj_arg;

	xmlSchemaSetValidErrors(ctxt, &libxml_xmlSchemaValidityErrorFunc, &libxml_xmlSchemaValidityWarningFunc, pyCtxt);

	py_retval = libxml_intWrap(1);
	return(py_retval);
}